

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::detail::
build_param_type_list<void,chaiscript::AST_Node&,std::shared_ptr<chaiscript::AST_Node>const&,std::shared_ptr<chaiscript::AST_Node>const&>
          (_func_void_AST_Node_ptr_shared_ptr<chaiscript::AST_Node>_ptr_shared_ptr<chaiscript::AST_Node>_ptr
           *param_1)

{
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_RDI;
  allocator_type *in_stack_ffffffffffffff78;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffff80;
  initializer_list<chaiscript::Type_Info> in_stack_ffffffffffffff88;
  
  user_type<void>();
  user_type<chaiscript::AST_Node&>();
  user_type<std::shared_ptr<chaiscript::AST_Node>const&>();
  user_type<std::shared_ptr<chaiscript::AST_Node>const&>();
  std::allocator<chaiscript::Type_Info>::allocator((allocator<chaiscript::Type_Info> *)0x3d31db);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff78);
  std::allocator<chaiscript::Type_Info>::~allocator((allocator<chaiscript::Type_Info> *)0x3d3206);
  return in_RDI;
}

Assistant:

std::vector<Type_Info> build_param_type_list(Ret (*)(Params...))
        {
          /// \note somehow this is responsible for a large part of the code generation
          return { user_type<Ret>(), user_type<Params>()... };
        }